

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-apply.cc
# Opt level: O2

bool tinyusdz::tydra::ApplyToXformable
               (Stage *stage,Prim *prim,
               function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)> *fn)

{
  bool bVar1;
  GeomMesh *__args_1;
  SkelRoot *__args_1_00;
  SkelRoot *pSVar2;
  
  __args_1 = (GeomMesh *)Prim::as<tinyusdz::GPrim>(prim);
  if (__args_1 == (GeomMesh *)0x0) {
    __args_1 = (GeomMesh *)Prim::as<tinyusdz::Xform>(prim);
    if (__args_1 == (GeomMesh *)0x0) {
      __args_1 = Prim::as<tinyusdz::GeomMesh>(prim);
      if (__args_1 == (GeomMesh *)0x0) {
        __args_1 = (GeomMesh *)Prim::as<tinyusdz::GeomSphere>(prim);
        if (__args_1 == (GeomMesh *)0x0) {
          __args_1 = (GeomMesh *)Prim::as<tinyusdz::GeomCapsule>(prim);
          if (__args_1 == (GeomMesh *)0x0) {
            __args_1 = (GeomMesh *)Prim::as<tinyusdz::GeomCube>(prim);
            if (__args_1 == (GeomMesh *)0x0) {
              __args_1 = (GeomMesh *)Prim::as<tinyusdz::GeomPoints>(prim);
              if (__args_1 == (GeomMesh *)0x0) {
                __args_1 = (GeomMesh *)Prim::as<tinyusdz::GeomCylinder>(prim);
                if (__args_1 == (GeomMesh *)0x0) {
                  __args_1 = (GeomMesh *)Prim::as<tinyusdz::GeomBasisCurves>(prim);
                  if (__args_1 == (GeomMesh *)0x0) {
                    __args_1_00 = Prim::as<tinyusdz::SkelRoot>(prim);
                    pSVar2 = __args_1_00;
                    if (__args_1_00 != (SkelRoot *)0x0) {
                      bVar1 = ::std::
                              function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>
                              ::operator()(fn,stage,&__args_1_00->super_Xformable);
                      pSVar2 = (SkelRoot *)(ulong)bVar1;
                    }
                    return (bool)(__args_1_00 != (SkelRoot *)0x0 & (byte)pSVar2);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar1 = ::std::function<bool_(const_tinyusdz::Stage_&,_const_tinyusdz::Xformable_*)>::operator()
                    (fn,stage,(Xformable *)__args_1);
  return bVar1;
}

Assistant:

bool ApplyToXformable(
  const Stage &stage, const Prim &prim,
  std::function<bool(const Stage &stage, const Xformable *xformable)> fn) {

  (void)stage;

#define APPLY_FUN(__ty) { \
  const auto *v = prim.as<__ty>(); \
  if (v) { \
    return fn(stage, v); \
  } \
  }

  APPLY_FUN(GPrim)
  APPLY_FUN(Xform)
  APPLY_FUN(GeomMesh)
  APPLY_FUN(GeomSphere)
  APPLY_FUN(GeomCapsule)
  APPLY_FUN(GeomCube)
  APPLY_FUN(GeomPoints)
  APPLY_FUN(GeomCylinder)
  APPLY_FUN(GeomBasisCurves)
  APPLY_FUN(SkelRoot)

#undef APPLY_FUN

  return false;

}